

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_dictionary.h
# Opt level: O0

void __thiscall c74::min::dict::dict(dict *this,t_dictionary *d,bool take_ownership)

{
  t_dictionary *ptVar1;
  bool take_ownership_local;
  t_dictionary *d_local;
  dict *this_local;
  
  this->m_instance = (t_dictionary *)0x0;
  this->m_has_ownership = true;
  if (d == (t_dictionary *)0x0) {
    ptVar1 = (t_dictionary *)dictionary_new();
    this->m_instance = ptVar1;
  }
  else {
    if (take_ownership) {
      object_retain(d);
    }
    else {
      this->m_has_ownership = false;
    }
    this->m_instance = d;
  }
  return;
}

Assistant:

dict(max::t_dictionary* d = nullptr, const bool take_ownership = true)
    {
        if (d == nullptr) {
            m_instance = max::dictionary_new();
        }
        else {
            if (take_ownership) {
                max::object_retain((max::t_object*)d);
            }
            else {
                m_has_ownership = false;
            }
            m_instance = d;
        }
    }